

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O3

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx,MppPacket dst,MppPacket src)

{
  undefined1 *puVar1;
  RK_U32 RVar2;
  void *pvVar3;
  size_t sVar4;
  RK_S64 v;
  undefined2 *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  MPP_RET MVar9;
  byte *pbVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  
  pvVar3 = mpp_packet_get_pos(src);
  sVar4 = mpp_packet_get_length(src);
  RVar2 = mpp_packet_get_eos(src);
  v = mpp_packet_get_pts(src);
  puVar5 = (undefined2 *)mpp_packet_get_data(dst);
  sVar6 = mpp_packet_get_length(dst);
  uVar13 = (uint)sVar6;
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_split");
  }
  uVar14 = 0;
  if (*(int *)((long)ctx + 0x30) == 0) {
    if (((sVar6 & 0xfffffffc) == 0) && ((*(uint *)((long)ctx + 0x2c) & 0xffffff) == 1)) {
      *puVar5 = 0;
      *(undefined1 *)(puVar5 + 1) = 1;
      uVar13 = 3;
    }
    uVar14 = 0;
    do {
      if ((sVar4 & 0xffffffff) == uVar14) {
        iVar12 = (int)uVar14;
        uVar14 = sVar4 & 0xffffffff;
        goto LAB_001abcd6;
      }
      uVar7 = uVar14 + uVar13;
      *(uint *)((long)ctx + 0x2c) =
           (uint)*(byte *)((long)pvVar3 + uVar14) | *(int *)((long)ctx + 0x2c) << 8;
      puVar1 = (undefined1 *)((long)pvVar3 + uVar14);
      uVar14 = uVar14 + 1;
      *(undefined1 *)((long)puVar5 + (uVar7 & 0xffffffff)) = *puVar1;
    } while (*(int *)((long)ctx + 0x2c) != 0x1b6);
    *(undefined4 *)((long)ctx + 0x30) = 1;
    mpp_packet_set_pts(dst,v);
    iVar12 = (int)uVar14;
LAB_001abcd6:
    sVar6 = (size_t)(uVar13 + iVar12);
    if (*(int *)((long)ctx + 0x30) == 0) {
LAB_001abd43:
      MVar9 = MPP_NOK;
      goto LAB_001abd48;
    }
  }
  uVar13 = (uint)uVar14;
  uVar7 = uVar14 & 0xffffffff;
  if (uVar13 <= (uint)sVar4) {
    uVar14 = sVar4;
  }
  uVar14 = uVar14 & 0xffffffff;
  pbVar10 = (byte *)((long)pvVar3 + uVar7);
  lVar8 = 0;
  do {
    if (uVar7 - uVar14 == lVar8) goto LAB_001abd43;
    *(uint *)((long)ctx + 0x2c) = (uint)*pbVar10 | *(int *)((long)ctx + 0x2c) << 8;
    iVar12 = (int)sVar6;
    uVar11 = sVar6 & 0xffffffff;
    sVar6 = (size_t)(iVar12 + 1);
    *(byte *)((long)puVar5 + uVar11) = *pbVar10;
    lVar8 = lVar8 + -1;
    pbVar10 = pbVar10 + 1;
  } while ((*(uint *)((long)ctx + 0x2c) & 0xffffff) != 1);
  sVar6 = (size_t)(iVar12 - 2);
  *(undefined4 *)((long)ctx + 0x30) = 0;
  MVar9 = MPP_OK;
  uVar14 = (ulong)(uVar13 - (int)lVar8);
LAB_001abd48:
  if ((RVar2 != 0) && ((uint)sVar4 <= (uint)uVar14)) {
    mpp_packet_set_eos(dst);
    MVar9 = MPP_OK;
  }
  mpp_packet_set_length(dst,sVar6 & 0xffffffff);
  mpp_packet_set_pos(src,(void *)((long)pvVar3 + (uVar14 & 0xffffffff)));
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_split");
  }
  return MVar9;
}

Assistant:

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    RK_U8 *src_buf = (RK_U8 *)mpp_packet_get_pos(src);
    RK_U32 src_len = (RK_U32)mpp_packet_get_length(src);
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S64 src_pts = mpp_packet_get_pts(src);
    RK_U8 *dst_buf = (RK_U8 *)mpp_packet_get_data(dst);
    RK_U32 dst_len = (RK_U32)mpp_packet_get_length(dst);
    RK_U32 src_pos = 0;

    mpg4d_dbg_func("in\n");

    // find the began of the vop
    if (!p->vop_header_found) {
        // add last startcode to the new frame data
        if ((dst_len < sizeof(p->state))
            && ((p->state & 0x00FFFFFF) == 0x000001)) {
            dst_buf[0] = 0;
            dst_buf[1] = 0;
            dst_buf[2] = 1;
            dst_len = 3;
        }
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if (p->state == MPG4_VOP_STARTCODE) {
                p->vop_header_found = 1;
                mpp_packet_set_pts(dst, src_pts);
                break;
            }
        }
    }
    // find the end of the vop
    if (p->vop_header_found) {
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if ((p->state & 0x00FFFFFF) == 0x000001) {
                dst_len -= 3;
                p->vop_header_found = 0;
                ret = MPP_OK; // split complete
                break;
            }
        }
    }
    // the last packet
    if (src_eos && src_pos >= src_len) {
        mpp_packet_set_eos(dst);
        ret = MPP_OK;
    }
    // reset the src and dst
    mpp_packet_set_length(dst, dst_len);
    mpp_packet_set_pos(src, src_buf + src_pos);

    mpg4d_dbg_func("out\n");

    return ret;
}